

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

const_iterator * __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::find<pstore::uint128,void>
          (const_iterator *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,database *db,uint128 *key)

{
  bool bVar1;
  index_pointer addr;
  pair<pstore::index::details::index_pointer,_unsigned_long> pVar2;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar3;
  parent_type local_250;
  value_type local_240;
  key_type *local_238;
  key_type existing_key;
  parent_type local_218;
  undefined4 local_204;
  index_pointer local_200 [3];
  index_pointer local_1e8;
  unsigned_long local_1e0;
  tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> local_1d8 [16];
  size_t local_1c8;
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  local_1c0;
  linear_node *local_1a8;
  linear_node *linear;
  index_pointer local_190;
  unsigned_long local_188;
  tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&> local_180 [32];
  size_t local_160;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_158;
  internal_node *local_140;
  internal_node *internal;
  size_t index;
  index_pointer child_node;
  shared_ptr<const_void> store_node;
  parent_stack parents;
  index_pointer node;
  index_pointer iStack_30;
  uint bit_shifts;
  hash_type hash;
  uint128 *key_local;
  database *db_local;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_local;
  
  bVar1 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::empty((hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                   *)this);
  if (bVar1) {
    hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::cend(__return_storage_ptr__,
           (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            *)this,db);
  }
  else {
    iStack_30 = (index_pointer)u128_hash::operator()((u128_hash *)(this + 0x28),key);
    node.addr_.a_._4_4_ = 0;
    parents.elements_ = *(size_t *)(this + 0x18);
    addr = iStack_30;
    array_stack<pstore::index::details::parent_type,_13UL>::array_stack
              ((array_stack<pstore::index::details::parent_type,_13UL> *)
               &store_node.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)&child_node.addr_);
    while( true ) {
      bVar1 = details::index_pointer::is_leaf((index_pointer *)&parents.elements_);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      details::index_pointer::index_pointer((index_pointer *)&index);
      internal = (internal_node *)0x0;
      bVar1 = details::depth_is_internal_node(node.addr_.a_._4_4_);
      if (bVar1) {
        local_140 = (internal_node *)0x0;
        local_160 = parents.elements_;
        details::internal_node::get_node(&local_158,db,(index_pointer)parents.elements_);
        std::tie<std::shared_ptr<void_const>,pstore::index::details::internal_node_const*>
                  ((shared_ptr<const_void> *)local_180,&child_node.internal_);
        std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
        operator=(local_180,&local_158);
        std::
        pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
        ::~pair(&local_158);
        pVar2 = details::internal_node::lookup(local_140,(ulong)(iStack_30._0_4_ & 0x3f));
        local_188 = pVar2.second;
        addr = pVar2.first;
        local_190 = addr;
        std::tie<pstore::index::details::index_pointer,unsigned_long>
                  ((index_pointer *)&linear,&index);
        std::tuple<pstore::index::details::index_pointer&,unsigned_long&>::operator=
                  ((tuple<pstore::index::details::index_pointer&,unsigned_long&> *)&linear,
                   (pair<pstore::index::details::index_pointer,_unsigned_long> *)&local_190.addr_);
      }
      else {
        local_1a8 = (linear_node *)0x0;
        local_1c8 = parents.elements_;
        details::linear_node::get_node(&local_1c0,db,(index_pointer)parents.elements_);
        std::tie<std::shared_ptr<void_const>,pstore::index::details::linear_node_const*>
                  ((shared_ptr<const_void> *)local_1d8,&child_node.linear_);
        std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::
        operator=(local_1d8,&local_1c0);
        std::
        pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
        ::~pair(&local_1c0);
        pVar3 = details::linear_node::
                lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
                          (local_1a8,db,key);
        local_1e0 = pVar3.second;
        addr = pVar3.first;
        local_1e8 = addr;
        std::tie<pstore::index::details::index_pointer,unsigned_long>(local_200,&index);
        std::tuple<pstore::index::details::index_pointer&,unsigned_long&>::operator=
                  ((tuple<pstore::index::details::index_pointer&,unsigned_long&> *)
                   &local_200[0].addr_,
                   (pair<const_pstore::index::details::index_pointer,_unsigned_long> *)
                   &local_1e8.addr_);
      }
      if (internal == (internal_node *)0xffffffffffffffff) {
        hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        ::cend(__return_storage_ptr__,
               (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)this,db);
        goto LAB_0016d857;
      }
      details::parent_type::parent_type
                (&local_218,(index_pointer)parents.elements_,(size_t)internal);
      array_stack<pstore::index::details::parent_type,_13UL>::push
                ((array_stack<pstore::index::details::parent_type,_13UL> *)
                 &store_node.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_218);
      parents.elements_ = index;
      node.addr_.a_._4_4_ = node.addr_.a_._4_4_ + 6;
      iStack_30.internal_ = iStack_30.internal_ >> 6;
    }
    bVar1 = details::index_pointer::is_leaf((index_pointer *)&parents.elements_);
    if (!bVar1) {
      assert_failed("node.is_leaf ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x460);
    }
    local_240 = (value_type)details::index_pointer::to_address((index_pointer *)&parents.elements_);
    local_238 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                ::get_key((key_type *)this,
                          (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                           *)db,(database *)local_240,addr.addr_);
    bVar1 = std::equal_to<pstore::uint128>::operator()
                      ((equal_to<pstore::uint128> *)(this + 0x29),(uint128 *)&local_238,key);
    if (bVar1) {
      details::parent_type::parent_type
                (&local_250,(index_pointer)parents.elements_,0xffffffffffffffff);
      array_stack<pstore::index::details::parent_type,_13UL>::push
                ((array_stack<pstore::index::details::parent_type,_13UL> *)
                 &store_node.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_250);
      hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
      ::iterator_base<true>::iterator_base
                (__return_storage_ptr__,db,
                 (parent_stack *)
                 &store_node.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                  *)this);
    }
    else {
      hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
      ::cend(__return_storage_ptr__,
             (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
              *)this,db);
    }
LAB_0016d857:
    local_204 = 1;
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)&child_node.addr_);
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }